

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepGetNumRhsEvals(void *arkode_mem,long *fe_evals,long *fi_evals)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepGetNumRhsEvals",&local_18,&local_20);
  if (iVar1 == 0) {
    *fe_evals = local_20->nfe;
    *fi_evals = local_20->nfi;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKStepGetNumRhsEvals(void *arkode_mem, long int *fe_evals,
                          long int *fi_evals)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepGetNumRhsEvals",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* get values from step_mem */
  *fe_evals = step_mem->nfe;
  *fi_evals = step_mem->nfi;

  return(ARK_SUCCESS);
}